

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Header>::moveAppend(QGenericArrayOps<Header> *this,Header *b,Header *e)

{
  qsizetype *pqVar1;
  Header *pHVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<Header>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Header>).size;
      local_40.__lhs =
           (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar2 + lVar3);
      *(__index_type *)
       ((long)&pHVar2[lVar3].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      *(__index_type *)
       ((long)&pHVar2[lVar3].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) =
           *(__index_type *)
            ((long)&(b->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(b->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)b);
      pDVar4 = (b->value).d.d;
      (b->value).d.d = (Data *)0x0;
      pHVar2[lVar3].value.d.d = pDVar4;
      pcVar5 = (b->value).d.ptr;
      (b->value).d.ptr = (char *)0x0;
      pHVar2[lVar3].value.d.ptr = pcVar5;
      qVar6 = (b->value).d.size;
      (b->value).d.size = 0;
      pHVar2[lVar3].value.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Header>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }